

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ms_senone.c
# Opt level: O0

int32 senone_eval(senone_t *s,int id,gauden_dist_t **dist,int32 n_top)

{
  byte bVar1;
  gauden_dist_t *pgVar2;
  int local_50;
  int local_4c;
  gauden_dist_t *fdist;
  uint local_38;
  int32 t;
  int32 f;
  int32 fwscr;
  int32 fscr;
  int32 fden;
  int32 scr;
  int32 n_top_local;
  gauden_dist_t **dist_local;
  int id_local;
  senone_t *s_local;
  
  if ((id < 0) || (s->n_sen <= (uint)id)) {
    __assert_fail("(id >= 0) && ((uint32)id < s->n_sen)",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_senone.c"
                  ,0x16f,"int32 senone_eval(senone_t *, int, gauden_dist_t **, int32)");
  }
  if ((0 < n_top) && ((uint)n_top <= s->n_cw)) {
    fscr = 0;
    for (local_38 = 0; local_38 < s->n_feat; local_38 = local_38 + 1) {
      pgVar2 = dist[(int)local_38];
      if (-2.1474836e+09 < (float)pgVar2->dist || (float)pgVar2->dist == -2.1474836e+09) {
        fwscr = (int)(float)pgVar2->dist + 0x3ff >> 10;
      }
      else {
        fwscr = -0x200000;
      }
      if (s->n_gauden < 2) {
        bVar1 = s->pdf[(int)local_38][pgVar2->id][id];
      }
      else {
        bVar1 = s->pdf[id][(int)local_38][pgVar2->id];
      }
      local_4c = fwscr - (uint)bVar1;
      f = local_4c;
      for (fdist._4_4_ = 1; fdist._4_4_ < n_top; fdist._4_4_ = fdist._4_4_ + 1) {
        if (-2.1474836e+09 < (float)pgVar2[fdist._4_4_].dist ||
            (float)pgVar2[fdist._4_4_].dist == -2.1474836e+09) {
          fwscr = (int)(float)pgVar2[fdist._4_4_].dist + 0x3ff >> 10;
        }
        else {
          fwscr = -0x200000;
        }
        if (s->n_gauden < 2) {
          bVar1 = s->pdf[(int)local_38][pgVar2[fdist._4_4_].id][id];
        }
        else {
          bVar1 = s->pdf[id][(int)local_38][pgVar2[fdist._4_4_].id];
        }
        local_50 = fwscr - (uint)bVar1;
        f = logmath_add(s->lmath,f,local_50);
      }
      fscr = fscr - f;
    }
    fscr = fscr / s->aw;
    if (0x7fff < fscr) {
      fscr = 0x7fff;
    }
    if (fscr < -0x8000) {
      fscr = -0x8000;
    }
    return fscr;
  }
  __assert_fail("(n_top > 0) && ((uint32)n_top <= s->n_cw)",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_senone.c"
                ,0x170,"int32 senone_eval(senone_t *, int, gauden_dist_t **, int32)");
}

Assistant:

int32
senone_eval(senone_t * s, int id, gauden_dist_t ** dist, int32 n_top)
{
    int32 scr;                  /* total senone score */
    int32 fden;                 /* Gaussian density */
    int32 fscr;                 /* senone score for one feature */
    int32 fwscr;                /* senone score for one feature, one codeword */
    int32 f, t;
    gauden_dist_t *fdist;

    assert((id >= 0) && ((uint32)id < s->n_sen));
    assert((n_top > 0) && ((uint32)n_top <= s->n_cw));

    scr = 0;

    for (f = 0; (uint32)f < s->n_feat; f++) {
        fdist = dist[f];

        if (fdist[0].dist < (mfcc_t)MAX_NEG_INT32)
            fden = MAX_NEG_INT32 >> SENSCR_SHIFT;
        else
            fden = ((int32)fdist[0].dist + ((1<<SENSCR_SHIFT) - 1)) >> SENSCR_SHIFT;
        fscr = (s->n_gauden > 1)
	    ? (fden + -s->pdf[id][f][fdist[0].id])  /* untransposed */
	    : (fden + -s->pdf[f][fdist[0].id][id]); /* transposed */
        /* Remaining of n_top codewords for feature f */
        for (t = 1; t < n_top; t++) {
            if (fdist[t].dist < (mfcc_t)MAX_NEG_INT32)
                fden = MAX_NEG_INT32 >> SENSCR_SHIFT;
            else
                fden = ((int32)fdist[t].dist + ((1<<SENSCR_SHIFT) - 1)) >> SENSCR_SHIFT;
                
            fwscr = (s->n_gauden > 1) ?
                (fden + -s->pdf[id][f][fdist[t].id]) :
                (fden + -s->pdf[f][fdist[t].id][id]);
            fscr = logmath_add(s->lmath, fscr, fwscr);
        }
	/* Senone scores are also scaled, negated logs3 values.  Hence
	 * we have to negate the stuff we calculated above. */
        scr -= fscr;
    }
    /* Downscale scores. */
    scr /= s->aw;

    /* Avoid overflowing int16 */
    if (scr > 32767)
      scr = 32767;
    if (scr < -32768)
      scr = -32768;
    return scr;
}